

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PoolingLayerParams::PoolingLayerParams
          (PoolingLayerParams *this,PoolingLayerParams *from)

{
  uint32_t uVar1;
  ulong uVar2;
  bool bVar3;
  PoolingLayerParams_ValidCompletePadding *this_00;
  SamePadding *this_01;
  ValidPadding *this_02;
  undefined1 *puVar4;
  Arena *pAVar5;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PoolingLayerParams_004b5900;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->stride_,&from->stride_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  bVar3 = from->globalpooling_;
  this->avgpoolexcludepadding_ = from->avgpoolexcludepadding_;
  this->globalpooling_ = bVar3;
  this->type_ = from->type_;
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 0x1e) {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x1e;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ValidPadding>
                        (pAVar5);
    (this->PoolingPaddingType_).valid_ = this_02;
    if (from->_oneof_case_[0] == 0x1e) {
      puVar4 = (undefined1 *)(from->PoolingPaddingType_).valid_;
    }
    else {
      puVar4 = _ValidPadding_default_instance_;
    }
    ValidPadding::MergeFrom(this_02,(ValidPadding *)puVar4);
  }
  else if (uVar1 == 0x1f) {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x1f;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SamePadding>
                        (pAVar5);
    (this->PoolingPaddingType_).same_ = this_01;
    if (from->_oneof_case_[0] == 0x1f) {
      puVar4 = (undefined1 *)(from->PoolingPaddingType_).same_;
    }
    else {
      puVar4 = _SamePadding_default_instance_;
    }
    SamePadding::MergeFrom(this_01,(SamePadding *)puVar4);
  }
  else if (uVar1 == 0x20) {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x20;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_00 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::PoolingLayerParams_ValidCompletePadding>
                        (pAVar5);
    (this->PoolingPaddingType_).includelastpixel_ = this_00;
    if (from->_oneof_case_[0] == 0x20) {
      puVar4 = (undefined1 *)(from->PoolingPaddingType_).includelastpixel_;
    }
    else {
      puVar4 = _PoolingLayerParams_ValidCompletePadding_default_instance_;
    }
    PoolingLayerParams_ValidCompletePadding::MergeFrom
              (this_00,(PoolingLayerParams_ValidCompletePadding *)puVar4);
  }
  return;
}

Assistant:

PoolingLayerParams::PoolingLayerParams(const PoolingLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&type_, &from.type_,
    static_cast<size_t>(reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_)) + sizeof(globalpooling_));
  clear_has_PoolingPaddingType();
  switch (from.PoolingPaddingType_case()) {
    case kValid: {
      _internal_mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from._internal_valid());
      break;
    }
    case kSame: {
      _internal_mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from._internal_same());
      break;
    }
    case kIncludeLastPixel: {
      _internal_mutable_includelastpixel()->::CoreML::Specification::PoolingLayerParams_ValidCompletePadding::MergeFrom(from._internal_includelastpixel());
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PoolingLayerParams)
}